

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.hpp
# Opt level: O0

void __thiscall Excel::Book::onSheet(Book *this,size_t idx,wstring *name)

{
  vector<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
  *pvVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_RDX;
  vector<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
  *in_RSI;
  unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_> *in_RDI;
  __single_object sheet;
  unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_> *in_stack_ffffffffffffffd0;
  
  std::make_unique<Excel::Sheet,std::__cxx11::wstring_const&>(in_RDX);
  pvVar1 = (vector<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
            *)std::
              vector<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
              ::size((vector<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
                      *)(in_RDI + 1));
  if (pvVar1 <= in_RSI) {
    std::
    vector<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
    ::resize(in_RSI,(size_type)in_RDX);
  }
  std::
  vector<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
  ::operator[]((vector<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
                *)(in_RDI + 1),(size_type)in_RSI);
  std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>::operator=
            (in_stack_ffffffffffffffd0,in_RDI);
  std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>::~unique_ptr
            (in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void
Book::onSheet( size_t idx, const std::wstring & name )
{
	auto sheet = std::make_unique< Sheet > ( name );
	if( m_sheets.size() <= idx )
		m_sheets.resize( idx + 1 );
	m_sheets[ idx ] = std::move( sheet );
}